

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

bool __thiscall TPZFMatrix<float>::Compare(TPZFMatrix<float> *this,TPZSavable *copy,bool override)

{
  bool bVar1;
  TPZFMatrix<float> *A;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  stringstream sout;
  double local_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  if (copy != (TPZSavable *)0x0) {
    A = (TPZFMatrix<float> *)__dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
    if (A == (TPZFMatrix<float> *)0x0) {
      return false;
    }
    bVar1 = TPZMatrix<float>::Compare(&this->super_TPZMatrix<float>,copy,false);
    lVar3 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
    if (lVar3 < 1) {
      if (bVar1) {
        return true;
      }
      local_1d8 = 0.0;
    }
    else {
      fVar5 = 0.0;
      lVar4 = 0;
      do {
        bVar1 = (bool)(bVar1 & this->fElem[lVar4] == A->fElem[lVar4]);
        fVar5 = fVar5 + ABS(this->fElem[lVar4] - A->fElem[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar3 - lVar4 != 0);
      if (bVar1 != false) {
        return true;
      }
      local_1d8 = (double)fVar5;
    }
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,
               "virtual bool TPZFMatrix<float>::Compare(TPZSavable *, bool) [TVar = float]",0x4a);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," did not compare ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," number different terms ",0x18);
    poVar2 = std::ostream::_M_insert<long>((long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," number terms ",0xe);
    std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," difference in norm L1 ",0x17);
    std::ostream::_M_insert<double>(local_1d8);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1d0,local_1c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    if (override) {
      operator=(this,A);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        this->operator=(*fmat);
    }
    return matresult;
}